

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O2

bool lunasvg::parseSelectors(string_view *input,SelectorList *selectors)

{
  char __c;
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  PropertyID PVar4;
  int iVar5;
  size_type __n;
  size_t sVar6;
  Combinator CVar7;
  byte bVar8;
  AttributeSelector *this;
  byte local_e9;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  string name;
  string name_1;
  Selector selector;
  SimpleSelector local_68;
  
  do {
    selector.super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    selector.super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    selector.super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CVar7 = None;
    do {
      do {
        do {
          local_68.id = Star;
          local_68.pseudoClassSelectors.
          super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.pseudoClassSelectors.
          super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_68.attributeSelectors.
          super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_68.pseudoClassSelectors.
          super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.attributeSelectors.
          super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.attributeSelectors.
          super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          name._M_dataplus._M_p = (pointer)&name.field_2;
          name._M_string_length = 0;
          name.field_2._M_allocated_capacity =
               name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_68.combinator = CVar7;
          bVar2 = skipDelimiter(input,'*');
          if (bVar2) {
            local_68.id = Star;
LAB_00118d58:
            bVar2 = true;
          }
          else {
            bVar2 = readCSSIdentifier(input,&name);
            if (bVar2) {
              name_1._M_dataplus._M_p = (pointer)name._M_string_length;
              name_1._M_string_length = (size_type)name._M_dataplus._M_p;
              local_68.id = elementid((string_view *)&name_1);
              goto LAB_00118d58;
            }
            bVar2 = false;
          }
          std::__cxx11::string::~string((string *)&name);
          bVar8 = 0;
          do {
            bVar3 = skipDelimiter(input,'#');
            if (bVar3) {
              name._M_string_length = (long)&name.field_2 + 8;
              name.field_2._M_allocated_capacity = 0;
              name.field_2._M_local_buf[8] = '\0';
              name._M_dataplus._M_p._0_5_ = 0x1d00000000;
              name._M_dataplus._M_p._0_4_ = 1;
              bVar2 = readCSSIdentifier(input,(string *)&name._M_string_length);
              if (bVar2) {
                std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
                ::emplace_back<lunasvg::AttributeSelector>
                          (&local_68.attributeSelectors,(AttributeSelector *)&name);
              }
LAB_00118e1a:
              std::__cxx11::string::~string((string *)&name._M_string_length);
              bVar8 = bVar2 ^ 1;
            }
            else {
              bVar3 = skipDelimiter(input,'.');
              if (bVar3) {
                name._M_string_length = (long)&name.field_2 + 8;
                name.field_2._M_allocated_capacity = 0;
                name.field_2._M_local_buf[8] = '\0';
                name._M_dataplus._M_p._0_5_ = 0x300000000;
                name._M_dataplus._M_p._0_4_ = 3;
                bVar2 = readCSSIdentifier(input,(string *)&name._M_string_length);
                if (bVar2) {
                  std::
                  vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>::
                  emplace_back<lunasvg::AttributeSelector>
                            (&local_68.attributeSelectors,(AttributeSelector *)&name);
                }
                goto LAB_00118e1a;
              }
              bVar3 = skipDelimiter(input,'[');
              if (bVar3) {
                name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
                name_1._M_string_length = 0;
                name_1.field_2._M_allocated_capacity =
                     name_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                skipOptionalSpaces(input);
                bVar2 = readCSSIdentifier(input,&name_1);
                bVar8 = 1;
                if (bVar2) {
                  name._M_dataplus._M_p = name._M_dataplus._M_p & 0xffffff0000000000;
                  name._M_string_length = (long)&name.field_2 + 8;
                  name.field_2._M_allocated_capacity = 0;
                  name.field_2._M_local_buf[8] = '\0';
                  local_e8._M_str = name_1._M_dataplus._M_p;
                  local_e8._M_len = name_1._M_string_length;
                  PVar4 = propertyid(&local_e8);
                  name._M_dataplus._M_p =
                       (pointer)((ulong)CONCAT31(name._M_dataplus._M_p._5_3_,PVar4) << 0x20);
                  bVar2 = skipDelimiter(input,'=');
                  if (bVar2) {
                    name._M_dataplus._M_p._0_4_ = 1;
LAB_001191c2:
                    skipOptionalSpaces(input);
                    bVar2 = readCSSIdentifier(input,(string *)&name._M_string_length);
                    if (bVar2) goto LAB_00119258;
                    bVar8 = 1;
                    if (input->_M_len != 0) {
                      __c = *input->_M_str;
                      if ((__c == '\"') || (__c == '\'')) {
                        input->_M_str = input->_M_str + 1;
                        input->_M_len = input->_M_len - 1;
                        __n = std::basic_string_view<char,_std::char_traits<char>_>::find
                                        (input,__c,0);
                        if (__n != 0xffffffffffffffff) {
                          local_e8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                               (input,0,__n);
                          std::__cxx11::string::
                          assign<std::basic_string_view<char,std::char_traits<char>>>
                                    ((string *)&name._M_string_length,&local_e8);
                          input->_M_str = input->_M_str + __n + 1;
                          input->_M_len = input->_M_len - (__n + 1);
                          goto LAB_00119258;
                        }
                      }
                    }
                  }
                  else {
                    local_e8._M_str = "*=";
                    local_e8._M_len = 2;
                    bVar2 = skipString(input,&local_e8);
                    if (bVar2) {
                      name._M_dataplus._M_p._0_4_ = 2;
                      goto LAB_001191c2;
                    }
                    local_e8._M_str = "~=";
                    local_e8._M_len = 2;
                    bVar2 = skipString(input,&local_e8);
                    if (bVar2) {
                      name._M_dataplus._M_p._0_4_ = 3;
                      goto LAB_001191c2;
                    }
                    local_e8._M_str = "^=";
                    local_e8._M_len = 2;
                    bVar2 = skipString(input,&local_e8);
                    if (bVar2) {
                      name._M_dataplus._M_p._0_4_ = 4;
                      goto LAB_001191c2;
                    }
                    local_e8._M_str = "$=";
                    local_e8._M_len = 2;
                    bVar2 = skipString(input,&local_e8);
                    if (bVar2) {
                      name._M_dataplus._M_p._0_4_ = 5;
                      goto LAB_001191c2;
                    }
                    local_e8._M_str = "|=";
                    local_e8._M_len = 2;
                    bVar2 = skipString(input,&local_e8);
                    if (bVar2) {
                      name._M_dataplus._M_p._0_4_ = 6;
                      goto LAB_001191c2;
                    }
                    if ((int)name._M_dataplus._M_p != 0) goto LAB_001191c2;
LAB_00119258:
                    skipOptionalSpaces(input);
                    bVar2 = skipDelimiter(input,']');
                    bVar8 = 1;
                    if (bVar2) {
                      std::
                      vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
                      ::emplace_back<lunasvg::AttributeSelector>
                                (&local_68.attributeSelectors,(AttributeSelector *)&name);
                      bVar8 = 0;
                    }
                  }
                  std::__cxx11::string::~string((string *)&name._M_string_length);
                }
                this = (AttributeSelector *)&name_1;
              }
              else {
                bVar3 = skipDelimiter(input,':');
                if (!bVar3) {
                  if (!bVar2) {
                    bVar8 = bVar8 ^ 1;
                    goto LAB_001192e1;
                  }
                  break;
                }
                name._M_dataplus._M_p = (pointer)&name.field_2;
                name._M_string_length = 0;
                name.field_2._M_allocated_capacity =
                     name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                bVar2 = readCSSIdentifier(input,&name);
                bVar8 = 1;
                this = (AttributeSelector *)&name;
                if (bVar2) {
                  name_1._M_dataplus._M_p = name_1._M_dataplus._M_p & 0xffffffff00000000;
                  name_1._M_string_length = 0;
                  name_1.field_2._M_allocated_capacity = 0;
                  name_1.field_2._8_8_ = 0;
                  iVar5 = std::__cxx11::string::compare((char *)&name);
                  if (iVar5 == 0) {
                    name_1._M_dataplus._M_p._0_4_ = 1;
LAB_001192a7:
                    std::
                    vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
                    ::emplace_back<lunasvg::PseudoClassSelector>
                              (&local_68.pseudoClassSelectors,(PseudoClassSelector *)&name_1);
                    bVar8 = 0;
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)&name);
                    if (iVar5 == 0) {
                      name_1._M_dataplus._M_p._0_4_ = 2;
                      goto LAB_001192a7;
                    }
                    iVar5 = std::__cxx11::string::compare((char *)&name);
                    if (iVar5 != 0) {
                      iVar5 = std::__cxx11::string::compare((char *)&name);
                      if (iVar5 == 0) {
                        name_1._M_dataplus._M_p._0_4_ = 5;
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)&name);
                        if (iVar5 == 0) {
                          name_1._M_dataplus._M_p._0_4_ = 6;
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)&name);
                          if (iVar5 == 0) {
                            name_1._M_dataplus._M_p._0_4_ = 7;
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)&name);
                            if (iVar5 == 0) {
                              name_1._M_dataplus._M_p._0_4_ = 8;
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)&name);
                              if (iVar5 == 0) {
                                name_1._M_dataplus._M_p._0_4_ = 9;
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)&name);
                                if (iVar5 == 0) {
                                  name_1._M_dataplus._M_p._0_4_ = 10;
                                }
                                else if ((int)name_1._M_dataplus._M_p - 3U < 2) goto LAB_00119095;
                              }
                            }
                          }
                        }
                      }
                      goto LAB_001192a7;
                    }
                    name_1._M_dataplus._M_p._0_4_ = 4;
LAB_00119095:
                    skipOptionalSpaces(input);
                    bVar2 = skipDelimiter(input,'(');
                    bVar8 = 1;
                    if (bVar2) {
                      skipOptionalSpaces(input);
                      bVar2 = parseSelectors(input,(SelectorList *)&name_1._M_string_length);
                      if (bVar2) {
                        skipOptionalSpaces(input);
                        bVar2 = skipDelimiter(input,')');
                        if (bVar2) goto LAB_001192a7;
                      }
                    }
                  }
                  std::
                  vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                  ::~vector((vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                             *)&name_1._M_string_length);
                }
              }
              std::__cxx11::string::~string((string *)this);
            }
            bVar2 = true;
          } while (bVar8 == 0);
          if (bVar8 == 0) {
            bVar2 = true;
            std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::
            emplace_back<lunasvg::SimpleSelector>(&selector,&local_68);
          }
          else {
            bVar8 = 0;
LAB_001192e1:
            local_e9 = CVar7 == Descendant & bVar8;
            bVar2 = false;
          }
          SimpleSelector::~SimpleSelector(&local_68);
          if (!bVar2) {
            if ((local_e9 & 1) == 0) {
              bVar2 = false;
              goto LAB_001193fb;
            }
            goto LAB_001193e4;
          }
          sVar6 = input->_M_len;
          bVar2 = false;
          pbVar1 = (byte *)input->_M_str;
          while( true ) {
            sVar6 = sVar6 - 1;
            if (((sVar6 == 0xffffffffffffffff) || (0x20 < (ulong)*pbVar1)) ||
               ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0)) break;
            input->_M_str = (char *)(pbVar1 + 1);
            input->_M_len = sVar6;
            bVar2 = true;
            pbVar1 = pbVar1 + 1;
          }
          bVar3 = skipDelimiterAndOptionalSpaces(input,'>');
          CVar7 = Child;
        } while (bVar3);
        bVar3 = skipDelimiterAndOptionalSpaces(input,'+');
        CVar7 = DirectAdjacent;
      } while (bVar3);
      bVar3 = skipDelimiterAndOptionalSpaces(input,'~');
      CVar7 = (uint)bVar3 + (uint)bVar3 * 2 + Descendant;
    } while (bVar2 || bVar3);
LAB_001193e4:
    bVar2 = true;
    std::
    vector<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>,std::allocator<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>>
    ::emplace_back<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>
              ((vector<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>,std::allocator<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>>
                *)selectors,&selector);
LAB_001193fb:
    std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::~vector
              (&selector);
    if ((bVar2 == false) || (bVar3 = skipDelimiterAndOptionalSpaces(input,','), !bVar3)) {
      return bVar2;
    }
  } while( true );
}

Assistant:

static bool parseSelectors(std::string_view& input, SelectorList& selectors)
{
    do {
        Selector selector;
        if(!parseSelector(input, selector))
            return false;
        selectors.push_back(std::move(selector));
    } while(skipDelimiterAndOptionalSpaces(input, ','));
    return true;
}